

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_str_kv_test.cc
# Opt level: O2

void kv_set_var_nentry_update_test(void)

{
  uint64_t uVar1;
  int iVar2;
  bnode *__ptr;
  size_t sVar3;
  char *pcVar4;
  void **ppvVar5;
  long lVar6;
  long lVar7;
  void *apvStack_168 [5];
  undefined8 local_140;
  void *local_138 [6];
  btree_kv_ops local_108;
  undefined1 local_88 [8];
  timeval __test_begin;
  char *keys [6];
  undefined1 local_31 [8];
  uint8_t v;
  
  lVar6 = 0;
  local_140 = 0x101d6c;
  gettimeofday((timeval *)local_88,(__timezone_ptr_t)0x0);
  local_140 = 0x101d71;
  memleak_start();
  __test_begin.tv_usec = (long)"longstring" + 4;
  local_140 = 0x101d9f;
  __ptr = dummy_node('\t','\x01',1);
  __ptr->nentry = 6;
  local_31[0] = 100;
  local_140 = 0x101dbc;
  btree_str_kv_get_kb64_vb64(&local_108);
  ppvVar5 = local_138;
  lVar7 = 0;
  while( true ) {
    if (lVar6 == 6) {
      local_140 = 0x101e4a;
      freevars(local_138,6);
      lVar7 = 0;
      lVar6 = 0;
      ppvVar5 = apvStack_168;
      while( true ) {
        if (lVar7 == 6) {
          (*local_108.set_kv)(__ptr,3,apvStack_168,local_31);
          lVar7 = 0;
          (*local_108.set_kv)(__ptr,0,&local_140,local_31);
          __test_begin.tv_usec = (__suseconds_t)anon_var_dwarf_f35;
          (*local_108.set_kv)(__ptr,5,apvStack_168,local_31);
          uVar1 = (__ptr->field_4).dummy;
          lVar6 = 0;
          while( true ) {
            if (lVar7 == 6) {
              free(__ptr);
              freevars(apvStack_168,6);
              memleak_end();
              pcVar4 = "%s PASSED\n";
              if (kv_set_var_nentry_update_test()::__test_pass != '\0') {
                pcVar4 = "%s FAILED\n";
              }
              fprintf(_stderr,pcVar4,"kv_set_var_nentry_update_test");
              return;
            }
            pcVar4 = keys[lVar7 + -1];
            iVar2 = strcmp((char *)(uVar1 + 2 + lVar6),pcVar4);
            if (iVar2 != 0) break;
            sVar3 = strlen(pcVar4);
            lVar6 = lVar6 + sVar3 + 4;
            lVar7 = lVar7 + 1;
          }
          fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_str_kv_test.cc"
                  ,0x19c);
          kv_set_var_nentry_update_test()::__test_pass = 1;
          __assert_fail("cmp == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_str_kv_test.cc"
                        ,0x19c,"void kv_set_var_nentry_update_test()");
        }
        pcVar4 = keys[lVar7 + -1];
        sVar3 = strlen(pcVar4);
        construct_key_ptr(pcVar4,(short)sVar3 + 1,ppvVar5);
        (*local_108.set_kv)(__ptr,(idx_t)lVar7,ppvVar5,local_31);
        iVar2 = strcmp((char *)((long)(__ptr->field_4).data + lVar6 + 2),pcVar4);
        if (iVar2 != 0) break;
        sVar3 = strlen(pcVar4);
        lVar6 = lVar6 + sVar3 + 4;
        lVar7 = lVar7 + 1;
        ppvVar5 = ppvVar5 + 1;
      }
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_str_kv_test.cc"
              ,0x184);
      kv_set_var_nentry_update_test()::__test_pass = 1;
      __assert_fail("cmp == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_str_kv_test.cc"
                    ,0x184,"void kv_set_var_nentry_update_test()");
    }
    pcVar4 = keys[lVar6 + -1];
    local_140 = 0x101dd9;
    sVar3 = strlen(pcVar4);
    local_140 = 0x101dee;
    construct_key_ptr(pcVar4,(short)sVar3 + 1,ppvVar5);
    local_140 = 0x101e07;
    (*local_108.set_kv)(__ptr,(idx_t)lVar6,ppvVar5,local_31);
    local_140 = 0x101e1b;
    iVar2 = strcmp((char *)((long)(__ptr->field_4).data + lVar7 + 2),pcVar4);
    if (iVar2 != 0) break;
    local_140 = 0x101e2b;
    sVar3 = strlen(pcVar4);
    lVar7 = lVar7 + sVar3 + 4;
    lVar6 = lVar6 + 1;
    ppvVar5 = ppvVar5 + 1;
  }
  local_140 = 0x101ff9;
  fprintf(_stderr,"Test failed: %s %d\n",
          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_str_kv_test.cc"
          ,0x173);
  kv_set_var_nentry_update_test()::__test_pass = 1;
  local_140 = 0x10201b;
  __assert_fail("cmp == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_str_kv_test.cc"
                ,0x173,"void kv_set_var_nentry_update_test()");
}

Assistant:

void kv_set_var_nentry_update_test()
{
    TEST_INIT();
    memleak_start();

    bnoderef node;
    btree_kv_ops *kv_ops;
    uint8_t ksize, vsize;
    uint8_t v;
    int cmp, i;

    const char *keys[] = {"string",
                          "longstring",
                          "longerstring",
                          "",
                          "123231234242423428492342",
                          "string WITH space"};

    int n =  sizeof(keys)/sizeof(void *);
    void **key_ptrs = alca(void *, n);

    ksize = strlen(keys[0]) + 1 + sizeof(key_len_t);
    vsize = sizeof(v);
    node = dummy_node(ksize, vsize, 1);
    node->nentry = n;

    v = 100;
    kv_ops = alca(btree_kv_ops, 1);
    btree_str_kv_get_kb64_vb64(kv_ops);
    size_t offset_idx = 0;

    // first pass
    for (i = 0; i < n; i++) {
        construct_key_ptr(keys[i], strlen(keys[i]) + 1, &key_ptrs[i]);
        kv_ops->set_kv(node, i, &key_ptrs[i], (void *)&v);

        // basic node->data verification
        offset_idx += sizeof(key_len_t);
        char *node_str = (char *)((uint8_t *)node->data + offset_idx);
        cmp = strcmp(node_str, keys[i]);
        TEST_CHK(cmp == 0);
        offset_idx += vsize + strlen(keys[i]) + 1;
    }

    freevars(key_ptrs, n);
    key_ptrs = alca(void *, n);
    offset_idx = 0;

    // second pass
    for (i = 0; i < n; i++) {
        construct_key_ptr(keys[i], strlen(keys[i]) + 1, &key_ptrs[i]);
        kv_ops->set_kv(node, i, &key_ptrs[i], (void *)&v);

        // basic node->data verification
        offset_idx += sizeof(key_len_t);
        char *node_str = (char *)((uint8_t *)node->data + offset_idx);
        cmp = strcmp(node_str, keys[i]);
        TEST_CHK(cmp == 0);
        offset_idx += vsize + strlen(keys[i]) + 1;
    }

    /* swap entries */

    // copy first key to middle
    kv_ops->set_kv(node, n/2, &key_ptrs[0], (void *)&v);
    keys[n/2] = keys[0];

    // copy last key to first
    kv_ops->set_kv(node, 0, &key_ptrs[n-1], (void *)&v);
    keys[0] = keys[n - 1];

    // copy middle key to last
    kv_ops->set_kv(node, n - 1, &key_ptrs[0], (void *)&v);
    keys[n - 1] = keys[n/2];

    // verify
    offset_idx = 0;
    for (i = 0; i < n; i++) {
        offset_idx += sizeof(key_len_t);
        char *node_str = (char *)((uint8_t *)node->data + offset_idx);
        cmp = strcmp(node_str, keys[i]);
        TEST_CHK(cmp == 0);
        offset_idx += vsize + strlen(keys[i]) + 1;
    }

    free(node);
    freevars(key_ptrs, n);
    memleak_end();
    TEST_RESULT("kv_set_var_nentry_update_test");
}